

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewReference(xmlDoc *doc,xmlChar *name)

{
  int len;
  xmlNodePtr cur;
  xmlChar *name_00;
  xmlEntityPtr pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  
  if ((name != (xmlChar *)0x0) && (cur = (xmlNodePtr)(*xmlMalloc)(0x78), cur != (xmlNodePtr)0x0)) {
    cur->_private = (void *)0x0;
    *(undefined8 *)&cur->type = 0;
    cur->doc = (_xmlDoc *)0x0;
    cur->ns = (xmlNs *)0x0;
    cur->nsDef = (xmlNs *)0x0;
    cur->psvi = (void *)0x0;
    cur->content = (xmlChar *)0x0;
    cur->properties = (_xmlAttr *)0x0;
    cur->next = (_xmlNode *)0x0;
    cur->prev = (_xmlNode *)0x0;
    cur->last = (_xmlNode *)0x0;
    cur->parent = (_xmlNode *)0x0;
    cur->name = (xmlChar *)0x0;
    cur->children = (_xmlNode *)0x0;
    cur->line = 0;
    cur->extra = 0;
    *(undefined4 *)&cur->field_0x74 = 0;
    cur->type = XML_ENTITY_REF_NODE;
    cur->doc = doc;
    if (*name == '&') {
      len = xmlStrlen(name + 1);
      if (name[len] == ';') {
        len = len + -1;
      }
      name_00 = xmlStrndup(name + 1,len);
    }
    else {
      name_00 = xmlStrdup(name);
    }
    cur->name = name_00;
    if (name_00 != (xmlChar *)0x0) {
      pxVar1 = xmlGetDocEntity(doc,name_00);
      if (pxVar1 != (xmlEntityPtr)0x0) {
        cur->content = pxVar1->content;
        cur->children = (_xmlNode *)pxVar1;
        cur->last = (_xmlNode *)pxVar1;
      }
      if (xmlRegisterCallbacks == 0) {
        return cur;
      }
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var2 == (xmlRegisterNodeFunc)0x0) {
        return cur;
      }
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      (**pp_Var2)(cur);
      return cur;
    }
    xmlFreeNode(cur);
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlNewReference(const xmlDoc *doc, const xmlChar *name) {
    xmlNodePtr cur;
    xmlEntityPtr ent;

    if (name == NULL)
        return(NULL);

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ENTITY_REF_NODE;

    cur->doc = (xmlDoc *)doc;
    if (name[0] == '&') {
        int len;
        name++;
	len = xmlStrlen(name);
	if (name[len - 1] == ';')
	    cur->name = xmlStrndup(name, len - 1);
	else
	    cur->name = xmlStrndup(name, len);
    } else
	cur->name = xmlStrdup(name);
    if (cur->name == NULL)
        goto error;

    ent = xmlGetDocEntity(doc, cur->name);
    if (ent != NULL) {
	cur->content = ent->content;
	/*
	 * The parent pointer in entity is a DTD pointer and thus is NOT
	 * updated.  Not sure if this is 100% correct.
	 *  -George
	 */
	cur->children = (xmlNodePtr) ent;
	cur->last = (xmlNodePtr) ent;
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);

error:
    xmlFreeNode(cur);
    return(NULL);
}